

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void free_sym_typeinfo(MOJOSHADER_free f,void *d,MOJOSHADER_symbolTypeInfo *typeinfo)

{
  uint local_24;
  uint i;
  MOJOSHADER_symbolTypeInfo *typeinfo_local;
  void *d_local;
  MOJOSHADER_free f_local;
  
  for (local_24 = 0; local_24 < typeinfo->member_count; local_24 = local_24 + 1) {
    (*f)(typeinfo->members[local_24].name,d);
    free_sym_typeinfo(f,d,&typeinfo->members[local_24].info);
  }
  (*f)(typeinfo->members,d);
  return;
}

Assistant:

static void free_sym_typeinfo(MOJOSHADER_free f, void *d,
                              MOJOSHADER_symbolTypeInfo *typeinfo)
{
    unsigned int i;
    for (i = 0; i < typeinfo->member_count; i++)
    {
        f((void *) typeinfo->members[i].name, d);
        free_sym_typeinfo(f, d, &typeinfo->members[i].info);
    } // for
    f((void *) typeinfo->members, d);
}